

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::ReservedNamePrefix(string *classname,FileDescriptor *file)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar1;
  FileDescriptor *in_RDX;
  string *in_RSI;
  string *in_RDI;
  int i;
  string lower;
  bool is_reserved;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  allocator *paVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  allocator local_7e;
  allocator local_7d;
  undefined4 local_7c;
  allocator local_75;
  int local_74;
  char *local_70;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  string local_40 [39];
  byte local_19;
  FileDescriptor *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_40,in_RSI);
  local_48 = std::__cxx11::string::begin();
  local_50 = std::__cxx11::string::end();
  local_58 = std::__cxx11::string::begin();
  __first._M_current._7_1_ = in_stack_ffffffffffffff4f;
  __first._M_current._0_7_ = in_stack_ffffffffffffff48;
  local_70 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (__first,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                (_func_int_int *)in_stack_ffffffffffffff30);
  local_74 = 0;
  do {
    if (0x48 < local_74) {
LAB_004a1ef1:
      if ((local_19 & 1) == 0) {
        paVar2 = &local_7e;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,"",paVar2);
        std::allocator<char>::~allocator((allocator<char> *)&local_7e);
      }
      else {
        FileDescriptor::package_abi_cxx11_(local_18);
        bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        if (bVar1) {
          paVar2 = &local_75;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)in_RDI,"GPB",paVar2);
          std::allocator<char>::~allocator((allocator<char> *)&local_75);
        }
        else {
          paVar2 = &local_7d;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)in_RDI,"PB",paVar2);
          std::allocator<char>::~allocator((allocator<char> *)&local_7d);
        }
      }
      local_7c = 1;
      std::__cxx11::string::~string(local_40);
      return in_RDI;
    }
    bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (bVar1) {
      local_19 = 1;
      goto LAB_004a1ef1;
    }
    local_74 = local_74 + 1;
  } while( true );
}

Assistant:

std::string ReservedNamePrefix(const string& classname,
                                const FileDescriptor* file) {
  bool is_reserved = false;

  string lower = classname;
  transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  if (is_reserved) {
    if (file->package() == "google.protobuf") {
      return "GPB";
    } else {
      return "PB";
    }
  }

  return "";
}